

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyHelper::computeBerdySensorMatrices
          (BerdyHelper *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y,VectorDynSize *bY)

{
  Triplets *this_00;
  Traversal *pTVar1;
  pointer plVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  undefined8 uVar7;
  Matrix<double,_6,_1,_0,_6,_1> *pMVar8;
  JointIndex JVar9;
  SpatialAcc *pSVar10;
  Transform *pTVar11;
  DOFIndex idx;
  long lVar12;
  size_t localDof;
  ulong uVar13;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *Y_00;
  Matrix<double,_6,_1,_0,_6,_1> *in_R8;
  size_t i;
  uint neigh_i;
  ulong uVar14;
  IndexRange IVar15;
  IndexRange IVar16;
  Transpose<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_200;
  MatrixFixSize<1U,_6U> *local_1f8 [2];
  Matrix1x6 SdynTree;
  Matrix<double,_6,_1,_0,_6,_1> local_188;
  SpatialMotionVector S;
  
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
            ((ulong)Y,this->m_nrOfSensorsMeasurements);
  Y_00 = (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)this->m_nrOfSensorsMeasurements;
  iDynTree::VectorDynSize::resize((ulong)bY);
  this_00 = &this->matrixYElements;
  iDynTree::Triplets::clear();
  iDynTree::VectorDynSize::zero();
  if ((this->m_options).berdyVariant != BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    computeBerdySensorsMatricesFromModel(this,Y_00,bY);
  }
  if ((this->m_options).includeAllJointAccelerationsAsSensors == true) {
    lVar12 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      if (lVar5 <= lVar12) break;
      IVar15 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,lVar12);
      IVar16 = getRangeDOFVariable(this,DOF_ACCELERATION,lVar12);
      iDynTree::Triplet::Triplet((Triplet *)&S,IVar15.offset,IVar16.offset,1.0);
      iDynTree::Triplets::pushTriplet((Triplet *)this_00);
      lVar12 = lVar12 + 1;
    }
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      lVar12 = 0;
      while( true ) {
        lVar5 = iDynTree::Model::getNrOfDOFs();
        if (lVar5 <= lVar12) break;
        IVar15 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,lVar12);
        IVar16 = getRangeDOFVariable(this,DOF_TORQUE,lVar12);
        iDynTree::Triplet::Triplet((Triplet *)&S,IVar15.offset,IVar16.offset,1.0);
        iDynTree::Triplets::pushTriplet((Triplet *)this_00);
        lVar12 = lVar12 + 1;
      }
    }
    else {
      pTVar1 = &this->m_dynamicsTraversal;
      uVar14 = 1;
      while( true ) {
        uVar3 = iDynTree::Traversal::getNrOfVisitedLinks();
        if (uVar3 <= uVar14) break;
        iDynTree::Traversal::getLink((long)pTVar1);
        iDynTree::Traversal::getParentLink((long)pTVar1);
        plVar6 = (long *)iDynTree::Traversal::getParentJoint((long)pTVar1);
        uVar7 = iDynTree::Link::getIndex();
        pMVar8 = (Matrix<double,_6,_1,_0,_6,_1> *)iDynTree::Link::getIndex();
        uVar3 = (**(code **)(*plVar6 + 0x20))(plVar6);
        lVar12 = (**(code **)(*plVar6 + 0xc0))(plVar6);
        for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
          in_R8 = pMVar8;
          (**(code **)(*plVar6 + 0x60))(&S,plVar6,uVar13 & 0xffffffff,uVar7);
          toEigen(&local_188,&S);
          local_200.m_matrix = &local_188;
          local_1f8[0] = &SdynTree;
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,1,6,1,1,6>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>const>>
                    ((Map<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_0,_Eigen::Stride<0,_0>_> *)local_1f8
                     ,&local_200);
          IVar15 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,lVar12 + uVar13);
          JVar9 = (**(code **)(*plVar6 + 0xa0))(plVar6);
          IVar16 = getRangeJointVariable(this,JOINT_WRENCH,JVar9);
          Triplets::addSubMatrix<1u,6u>(this_00,IVar15.offset,IVar16.offset,&SdynTree);
        }
        uVar14 = uVar14 + 1;
      }
    }
  }
  if ((this->m_options).includeAllNetExternalWrenchesAsSensors == true) {
    lVar12 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfLinks();
      if (lVar5 <= lVar12) break;
      if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
        iDynTree::Traversal::getBaseLink();
        lVar5 = iDynTree::Link::getIndex();
        if (lVar5 != lVar12) goto LAB_001ada44;
        if ((this->m_options).includeFixedBaseExternalWrench == true) {
          uVar3 = 0;
          while( true ) {
            uVar4 = iDynTree::Model::getNrOfNeighbors((long)this);
            if (uVar4 <= uVar3) break;
            uVar7 = iDynTree::Model::getNeighbor((long)this,(uint)lVar12);
            iDynTree::Model::getNeighbor((long)this,(uint)lVar12);
            plVar6 = (long *)iDynTree::Model::getJoint((long)this);
            (**(code **)(*plVar6 + 0x50))(plVar6,&this->m_jointPos,lVar12,uVar7);
            iDynTree::Transform::inverse();
            iDynTree::Transform::operator*((Transform *)&SdynTree,(Transform *)&S);
            IVar15 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar12);
            JVar9 = (**(code **)(*plVar6 + 0xa0))(plVar6);
            IVar16 = getRangeJointVariable(this,JOINT_WRENCH,JVar9);
            iDynTree::Transform::asAdjointTransformWrench();
            Triplets::addSubMatrix<6u,6u>
                      (this_00,IVar15.offset,IVar16.offset,(MatrixFixSize<6U,_6U> *)&S);
            uVar3 = uVar3 + 1;
          }
          iDynTree::Model::getLink((long)this);
          pSVar10 = (SpatialAcc *)iDynTree::Link::getInertia();
          iDynTree::SpatialInertia::operator*((SpatialInertia *)&SdynTree,pSVar10);
          iDynTree::Wrench::operator-((Wrench *)&S);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&SdynTree);
          IVar15 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar12);
          toEigen((Matrix<double,_6,_1,_0,_6,_1> *)&SdynTree,(SpatialForceVector *)&S);
          IVar16.size = (ptrdiff_t)&SdynTree;
          IVar16.offset = 6;
          setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                    ((iDynTree *)bY,(VectorDynSize *)IVar15.offset,IVar16,in_R8);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&S);
        }
      }
      else {
LAB_001ada44:
        IVar15 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar12);
        IVar16 = getRangeLinkVariable(this,NET_EXT_WRENCH,lVar12);
        iDynTree::Transform::inverse();
        iDynTree::Transform::asAdjointTransformWrench();
        Triplets::addSubMatrix<6u,6u>
                  (this_00,IVar15.offset,IVar16.offset,(MatrixFixSize<6U,_6U> *)&S);
      }
      lVar12 = lVar12 + 1;
    }
  }
  for (uVar14 = 0;
      plVar2 = (this->berdySensorsInfo).wrenchSensors.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar14 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                             super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)plVar2 >> 3);
      uVar14 = uVar14 + 1) {
    IVar15 = getRangeJointSensorVariable(this,JOINT_WRENCH_SENSOR,plVar2[uVar14]);
    IVar16 = getRangeJointVariable
                       (this,JOINT_WRENCH,
                        (this->berdySensorsInfo).wrenchSensors.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14]);
    iDynTree::Triplets::addDiagonalMatrix((ulong)this_00,IVar15.offset,1.0,IVar16.offset);
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar15 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    uVar14 = 0;
    while( true ) {
      uVar13 = iDynTree::Model::getNrOfLinks();
      if (uVar13 <= uVar14) break;
      IVar16 = getRangeLinkVariable(this,NET_EXT_WRENCH,uVar14);
      pTVar11 = (Transform *)iDynTree::LinkPositions::operator()(&this->base_H_links,uVar14);
      iDynTree::Transform::Transform((Transform *)&SdynTree,pTVar11);
      iDynTree::Transform::asAdjointTransformWrench();
      Triplets::addSubMatrix<6u,6u>(this_00,IVar15.offset,IVar16.offset,(MatrixFixSize<6U,_6U> *)&S)
      ;
      uVar14 = uVar14 + 1;
    }
  }
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets((Triplets *)Y);
  return true;
}

Assistant:

bool BerdyHelper::computeBerdySensorMatrices(SparseMatrix<iDynTree::ColumnMajor>& Y, VectorDynSize& bY)
{
    Y.resize(m_nrOfSensorsMeasurements,m_nrOfDynamicalVariables);
    bY.resize(m_nrOfSensorsMeasurements);
    // \todo TODO check if this is a bottleneck
//    Y.zero();
    matrixYElements.clear();
    bY.zero();

    // For now handle all sensor types explicitly TODO clean this up
    
    if(m_options.berdyVariant!=BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        if(!computeBerdySensorsMatricesFromModel(Y, bY))
        {
            return false;
        }
    }
    
    ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx< static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            // Y for the joint accelerations is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint acceleration in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);
            IndexRange jointAccRange = this->getRangeDOFVariable(DOF_ACCELERATION,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointAccRange.offset, 1));

            // bY for the joint acceleration is zero
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
        {
          for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
          {
              // Y for the joint torques is just a rows of 0s and one 1  corresponding to the location
            // of the relative joint torques in the dynamic variables vector
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);
            IndexRange jointTrqRange = this->getRangeDOFVariable(DOF_TORQUE,idx);

            matrixYElements.pushTriplet(Triplet(sensorRange.offset, jointTrqRange.offset, 1));

            // bY for the joint torques is zero
          }
        }
        else 
        {
            assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
            // We have to map the joint wrench to the joint torques, since joint wrench is considered as dynamic variable
            for (TraversalIndex traversalEl = 1;
                traversalEl < static_cast<TraversalIndex>(m_dynamicsTraversal.getNrOfVisitedLinks());
                traversalEl++)
            {
                LinkConstPtr visitedLink = m_dynamicsTraversal.getLink(traversalEl);
                LinkConstPtr parentLink = m_dynamicsTraversal.getParentLink(traversalEl);
                IJointConstPtr toParentJoint = m_dynamicsTraversal.getParentJoint(traversalEl);
                LinkIndex visitedLinkIdx = visitedLink->getIndex();
                LinkIndex parentLinkIdx = parentLink->getIndex();
            
                size_t jointDOFs = toParentJoint->getNrOfDOFs();
                size_t dofOffset = toParentJoint->getDOFsOffset();
            
                for (size_t localDof = 0; localDof < jointDOFs; localDof++)
                {
                    SpatialMotionVector S = toParentJoint->getMotionSubspaceVector(localDof, visitedLinkIdx, parentLinkIdx);
                    Matrix1x6 SdynTree;
                    toEigen(SdynTree) = toEigen(S).transpose();
              
                    matrixYElements.addSubMatrix(getRangeDOFSensorVariable(DOF_TORQUE_SENSOR, dofOffset + localDof).offset,
                                                 getRangeJointVariable(JOINT_WRENCH, toParentJoint->getIndex()).offset,
                                                 SdynTree);
                }
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            // If this link is the (fixed) base link and the
            // berdy variant is ORIGINAL_BERDY_FIXED_BASE , then
            // the net wrench applied on the base is not part of the dynamical
            // system. Anyhow, we can still write the base wrench as a function
            // of sum of the joint wrenches of all the joints attached to the base (tipically just one)
            if( m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                m_dynamicsTraversal.getBaseLink()->getIndex() == idx )
            {
                if(  m_options.includeFixedBaseExternalWrench  )
                {
                    // Y encodes the (time varyng) relation between the wrenches transmitted by the joint attached
                    // to the base and net external wrench applied on the robot
                    // \todo TODO this "get child" for is duplicated in the code, we
                    // should try to consolidate it
                    for(unsigned int neigh_i=0; neigh_i < m_model.getNrOfNeighbors(idx); neigh_i++)
                    {
                        LinkIndex neighborIndex = m_model.getNeighbor(idx,neigh_i).neighborLink;
                        LinkIndex childIndex = neighborIndex;
                        IJointConstPtr neighborJoint = m_model.getJoint(m_model.getNeighbor(idx,neigh_i).neighborJoint);
                        const Transform & base_X_child = neighborJoint->getTransform(m_jointPos,idx,childIndex);
                        Transform measurementFrame_X_child = m_link_H_externalWrenchMeasurementFrame[idx].inverse()*base_X_child;

                        matrixYElements.addSubMatrix(getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx).offset,
                                                     getRangeJointVariable(JOINT_WRENCH,neighborJoint->getIndex()).offset, measurementFrame_X_child.asAdjointTransformWrench());
                    }

                    // bY encodes the weight of the base link due to gravity (we omit the v*I*v as it is always zero)
                    Wrench baseLinkNetTotalWrenchesWithoutGrav = -(m_model.getLink(idx)->getInertia()*m_gravity6D);
                    setSubVector(bY,getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx),toEigen(baseLinkNetTotalWrenchesWithoutGrav));
                }
            }
            else
            {
                // Y for the net external wrenches is just
                // six rows of 0 with an identity placed at the location
                // of the net external wrenches in the dynamic variable vector
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);
                IndexRange netExtWrenchRange = this->getRangeLinkVariable(NET_EXT_WRENCH,idx);

                Transform measurementFrame_X_link = m_link_H_externalWrenchMeasurementFrame[idx].inverse();

                matrixYElements.addSubMatrix(sensorRange.offset,
                                             netExtWrenchRange.offset,
                                             measurementFrame_X_link.asAdjointTransformWrench());

                // bY for the net external wrenches is zero
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        // Y for the joint wrenches is just
        // six rows of 0 with an identity placed at the location
        // of the joint wrenches in the dynamic variable vector
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);
        IndexRange jointWrenchOffset = this->getRangeJointVariable(JOINT_WRENCH,berdySensorsInfo.wrenchSensors[i]);

        assert(sensorRange.size == 6);
        assert(jointWrenchOffset.size == 6);
        matrixYElements.addDiagonalMatrix(sensorRange,
                                          jointWrenchOffset,
                                          1);

        // bY for the joint wrenches is zero
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM) SENSOR
    ////////////////////////////////////////////////////////////////////////
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        // Get the row index corresponding to the RCM sensor
        IndexRange rcmRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        for(LinkIndex idx = 0 ; idx < m_model.getNrOfLinks(); idx++)
        {
            // Get the column index corresponding to the net link external wrench sensor
            IndexRange netExternalWrenchVariableIndexRange = this->getRangeLinkVariable(NET_EXT_WRENCH, idx);

            // Get base to link transform
            Transform base_X_link = base_H_links(idx);

            // Get link to base rotation
            matrixYElements.addSubMatrix(rcmRange.offset,
                                         netExternalWrenchVariableIndexRange.offset,
                                         base_X_link.asAdjointTransformWrench());
        }

        // bY for the RCM sensor is zero
    }

    Y.setFromTriplets(matrixYElements);
    return true;
}